

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

void nghttp2_http_record_request_method(nghttp2_stream *stream,nghttp2_frame *frame)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  long lStack_30;
  
  if ((frame->hd).type == '\x01') {
    lVar4 = 0x30;
    lStack_30 = 0x28;
  }
  else {
    if ((frame->hd).type != '\x05') {
      return;
    }
    lVar4 = 0x20;
    lStack_30 = 0x18;
  }
  lVar4 = *(long *)((long)frame + lVar4);
  plVar3 = (long *)(*(long *)((long)frame + lStack_30) + 0x18);
  while( true ) {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) {
      return;
    }
    if (((plVar3[-1] == 7) && (*(char *)(plVar3[-3] + 6) == 'd')) &&
       (iVar1 = bcmp(":metho",(void *)plVar3[-3],6), iVar1 == 0)) break;
    plVar3 = plVar3 + 5;
  }
  if (*plVar3 == 4) {
    if (*(int *)plVar3[-2] != 0x44414548) {
      return;
    }
    uVar2 = 0x100;
  }
  else {
    if (*plVar3 != 7) {
      return;
    }
    iVar1 = bcmp("CONNECT",(void *)plVar3[-2],7);
    if (iVar1 != 0) {
      return;
    }
    uVar2 = 0x80;
  }
  stream->http_flags = stream->http_flags | uVar2;
  return;
}

Assistant:

void nghttp2_http_record_request_method(nghttp2_stream *stream,
                                        nghttp2_frame *frame) {
  const nghttp2_nv *nva;
  size_t nvlen;
  size_t i;

  switch (frame->hd.type) {
  case NGHTTP2_HEADERS:
    nva = frame->headers.nva;
    nvlen = frame->headers.nvlen;
    break;
  case NGHTTP2_PUSH_PROMISE:
    nva = frame->push_promise.nva;
    nvlen = frame->push_promise.nvlen;
    break;
  default:
    return;
  }

  /* TODO we should do this strictly. */
  for (i = 0; i < nvlen; ++i) {
    const nghttp2_nv *nv = &nva[i];
    if (!(nv->namelen == 7 && nv->name[6] == 'd' &&
          memcmp(":metho", nv->name, nv->namelen - 1) == 0)) {
      continue;
    }
    if (lstreq("CONNECT", nv->value, nv->valuelen)) {
      stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_CONNECT;
      return;
    }
    if (lstreq("HEAD", nv->value, nv->valuelen)) {
      stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_HEAD;
      return;
    }
    return;
  }
}